

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O0

void __thiscall QResourceFileEnginePrivate::mapUncompressed(QResourceFileEnginePrivate *this)

{
  long lVar1;
  bool bVar2;
  qint64 qVar3;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QResource *in_stack_00000030;
  QByteArray *in_stack_ffffffffffffffc8;
  QResourceFileEnginePrivate *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QByteArray::isNull((QByteArray *)0x2eab8e);
  if ((bVar2) &&
     ((qVar3 = QResource::uncompressedSize((QResource *)in_RDI), qVar3 < 0x4000 ||
      (bVar2 = mapUncompressed_sys(in_stack_fffffffffffffff0), !bVar2)))) {
    QResource::uncompressedData(in_stack_00000030);
    QByteArray::operator=(in_RDI,in_stack_ffffffffffffffc8);
    QByteArray::~QByteArray((QByteArray *)0x2eabee);
    QByteArray::detach(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QResourceFileEnginePrivate::mapUncompressed()
{
    Q_ASSERT(resource.compressionAlgorithm() == QResource::NoCompression);
    if (!uncompressed.isNull())
        return;     // nothing to do

    if (resource.uncompressedSize() >= RemapCompressedThreshold) {
        if (mapUncompressed_sys())
            return;
    }

    uncompressed = resource.uncompressedData();
    uncompressed.detach();
}